

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoLocator.cpp
# Opt level: O2

RealType OpenMD::MoLocator::getMolMass(MoleculeStamp *molStamp,ForceField *myFF)

{
  ulong uVar1;
  long lVar2;
  bool bVar3;
  RealType RVar4;
  double local_58;
  string local_50;
  
  uVar1 = (ulong)((long)(molStamp->atomStamps_).
                        super__Vector_base<OpenMD::AtomStamp_*,_std::allocator<OpenMD::AtomStamp_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(molStamp->atomStamps_).
                       super__Vector_base<OpenMD::AtomStamp_*,_std::allocator<OpenMD::AtomStamp_*>_>
                       ._M_impl.super__Vector_impl_data._M_start) >> 3 & 0xffffffff;
  local_58 = 0.0;
  lVar2 = 0;
  while (bVar3 = uVar1 != 0, uVar1 = uVar1 - 1, bVar3) {
    std::__cxx11::string::string
              ((string *)&local_50,
               (string *)
               (*(long *)((long)(molStamp->atomStamps_).
                                super__Vector_base<OpenMD::AtomStamp_*,_std::allocator<OpenMD::AtomStamp_*>_>
                                ._M_impl.super__Vector_impl_data._M_start + (lVar2 >> 0x1d)) + 0x98)
              );
    RVar4 = getAtomMass(&local_50,myFF);
    local_58 = local_58 + RVar4;
    std::__cxx11::string::~string((string *)&local_50);
    lVar2 = lVar2 + 0x100000000;
  }
  return local_58;
}

Assistant:

RealType MoLocator::getMolMass(MoleculeStamp* molStamp, ForceField* myFF) {
    unsigned int nAtoms;
    RealType totMass = 0;
    nAtoms           = molStamp->getNAtoms();

    for (std::size_t i = 0; i < nAtoms; i++) {
      AtomStamp* currAtomStamp = molStamp->getAtomStamp(i);
      totMass += getAtomMass(currAtomStamp->getType(), myFF);
    }
    return totMass;
  }